

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int debug_getupvalue(lua_State *L,int get)

{
  char *pcVar1;
  int in_ESI;
  char *in_RDI;
  char *name;
  int32_t n;
  undefined8 in_stack_ffffffffffffffa8;
  lua_State *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int iVar2;
  lua_State *in_stack_ffffffffffffffd0;
  
  lj_lib_checkint((lua_State *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),
                  (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  lj_lib_checkfunc(in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  if (in_ESI == 0) {
    pcVar1 = lua_setupvalue(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                            in_stack_ffffffffffffffc8);
  }
  else {
    pcVar1 = lua_getupvalue(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                            in_stack_ffffffffffffffc8);
  }
  if (pcVar1 == (char *)0x0) {
    iVar2 = 0;
  }
  else {
    lua_pushstring((lua_State *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),in_RDI
                  );
    if (in_ESI == 0) {
      iVar2 = 1;
    }
    else {
      **(undefined8 **)(in_RDI + 0x18) = *(undefined8 *)(*(long *)(in_RDI + 0x18) + -0x10);
      *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 8;
      iVar2 = 2;
    }
  }
  return iVar2;
}

Assistant:

static int debug_getupvalue(lua_State *L, int get)
{
  int32_t n = lj_lib_checkint(L, 2);
  const char *name;
  lj_lib_checkfunc(L, 1);
  name = get ? lua_getupvalue(L, 1, n) : lua_setupvalue(L, 1, n);
  if (name) {
    lua_pushstring(L, name);
    if (!get) return 1;
    copyTV(L, L->top, L->top-2);
    L->top++;
    return 2;
  }
  return 0;
}